

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode settings_Alloc(CUPDLPsettings *settings)

{
  cupdlp_retcode retcode;
  CUPDLPsettings *settings_local;
  
  settings->nIterLim = 0x7fffffff;
  settings->nLogLevel = 2;
  settings->nLogInterval = 100;
  settings->dTimeLim = 3600.0;
  settings->ifScaling = 1;
  settings->iScalingMethod = 3;
  settings->dScalingLimit = 5.0;
  settings->eRestartMethod = PDHG_GPU_RESTART;
  settings->iInfNormAbsLocalTermination = 0;
  settings->dPrimalTol = 0.0001;
  settings->dDualTol = 0.0001;
  settings->dGapTol = 0.0001;
  return 0;
}

Assistant:

cupdlp_retcode settings_Alloc(CUPDLPsettings *settings) {
  cupdlp_retcode retcode = RETCODE_OK;
  // settings->nIterLim = INFINITY;
  settings->nIterLim = INT_MAX;  // INFINITY cause bug on MacOS
  settings->nLogLevel = 2; // Ensures that, by default, cuPDLP-C printing is unchanged
  settings->nLogInterval = 100;
  // settings->dTimeLim = INFINITY;
  settings->dTimeLim = 3600;
  settings->ifScaling = true;
  settings->iScalingMethod = 3;  // no use
  settings->dScalingLimit = 5;   // no use
  settings->eRestartMethod = PDHG_GPU_RESTART;
  settings->iInfNormAbsLocalTermination = 0;

  // termination criteria
  settings->dPrimalTol = 1e-4;
  settings->dDualTol = 1e-4;
  settings->dGapTol = 1e-4;

  return retcode;
}